

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_tree.c
# Opt level: O2

yajl_val yajl_tree_parse(char *input,char *error_buffer,size_t error_buffer_size)

{
  yajl_status yVar1;
  yajl_handle h;
  size_t sVar2;
  uchar *puVar3;
  undefined8 local_48;
  yajl_val pyStack_40;
  char *local_38;
  size_t local_30;
  
  local_48 = 0;
  pyStack_40 = (yajl_val)0x0;
  local_38 = error_buffer;
  local_30 = error_buffer_size;
  if (error_buffer != (char *)0x0) {
    memset(error_buffer,0,error_buffer_size);
  }
  h = yajl_alloc(&yajl_tree_parse::callbacks,(yajl_alloc_funcs *)0x0,&local_48);
  yajl_config(h,yajl_allow_comments);
  sVar2 = strlen(input);
  yajl_parse(h,(uchar *)input,sVar2);
  yVar1 = yajl_complete_parse(h);
  if (yVar1 == yajl_status_ok) {
    yajl_free(h);
  }
  else {
    if (error_buffer_size != 0 && error_buffer != (char *)0x0) {
      sVar2 = strlen(input);
      puVar3 = yajl_get_error(h,1,(uchar *)input,sVar2);
      snprintf(error_buffer,error_buffer_size,"%s",puVar3);
      (*(h->alloc).free)((h->alloc).ctx,puVar3);
    }
    yajl_free(h);
    pyStack_40 = (yajl_val)0x0;
  }
  return pyStack_40;
}

Assistant:

yajl_val yajl_tree_parse (const char *input,
                          char *error_buffer, size_t error_buffer_size)
{
    static const yajl_callbacks callbacks =
        {
            /* null        = */ handle_null,
            /* boolean     = */ handle_boolean,
            /* integer     = */ NULL,
            /* double      = */ NULL,
            /* number      = */ handle_number,
            /* string      = */ handle_string,
            /* start map   = */ handle_start_map,
            /* map key     = */ handle_string,
            /* end map     = */ handle_end_map,
            /* start array = */ handle_start_array,
            /* end array   = */ handle_end_array
        };

    yajl_handle handle;
    yajl_status status;
    char * internal_err_str;
	context_t ctx = { NULL, NULL, NULL, 0 };

	ctx.errbuf = error_buffer;
	ctx.errbuf_size = error_buffer_size;

    if (error_buffer != NULL)
        memset (error_buffer, 0, error_buffer_size);

    handle = yajl_alloc (&callbacks, NULL, &ctx);
    yajl_config(handle, yajl_allow_comments, 1);

    status = yajl_parse(handle,
                        (const unsigned char *) input,
                        strlen (input));
    status = yajl_complete_parse (handle);
    if (status != yajl_status_ok) {
        if (error_buffer != NULL && error_buffer_size > 0) {
               internal_err_str = (char *) yajl_get_error(handle, 1,
                     (const unsigned char *) input,
                     strlen(input));
             snprintf(error_buffer, error_buffer_size, "%s", internal_err_str);
             YA_FREE(&(handle->alloc), internal_err_str);
        }
        yajl_free (handle);
        return NULL;
    }

    yajl_free (handle);
    return (ctx.root);
}